

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  double dVar3;
  bool local_5d;
  char local_5c [3];
  bool local_59;
  char local_58 [4];
  char c [3];
  _Bool is_celsius;
  char str [50];
  double value;
  char **argv_local;
  int argc_local;
  
  while( true ) {
    printf("Please input a value: ");
    pcVar2 = fgets(local_58,0x32,_stdin);
    if (pcVar2 == (char *)0x0) {
      printf("\n");
      return 0;
    }
    iVar1 = __isoc99_sscanf(local_58,"%lf",str + 0x30);
    if (iVar1 != 0) break;
    printf("Invalid number!\n");
  }
  printf("Is this value in celsius or fahrenheit? [C/f] ");
  pcVar2 = fgets(local_5c,3,_stdin);
  if (pcVar2 != (char *)0x0) {
    iVar1 = toupper((int)local_5c[0]);
    local_5d = iVar1 == 0x43 || local_5c[0] == '\n';
    local_59 = local_5d;
    if (iVar1 == 0x43 || local_5c[0] == '\n') {
      dVar3 = c2f(stack0xffffffffffffffe0);
      printf(anon_var_dwarf_99,stack0xffffffffffffffe0,SUB84(dVar3,0));
      return 0;
    }
    dVar3 = f2c(stack0xffffffffffffffe0);
    printf(anon_var_dwarf_af,stack0xffffffffffffffe0,SUB84(dVar3,0));
    return 0;
  }
  printf("\n");
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  double value;

  while (true) {
    printf("Please input a value: ");
    char str[50];
    if (fgets(str, 50, stdin) == NULL) {
      printf("\n");
      return 0;
    }
    if (sscanf(str, "%lf", &value)) break;
    else printf("Invalid number!\n");
  }

  bool is_celsius;
  printf("Is this value in celsius or fahrenheit? [C/f] ");
  char c[3];
  if (fgets(c, 3, stdin) != NULL) {
    is_celsius = toupper(*c) == 'C' || *c == '\n';
  } else {
    printf("\n");
    return 0;
  }

  if (is_celsius) {
    printf("%.3lf°C = %.3lf°F\n", value, c2f(value));
  } else {
    printf("%.3lf°F = %.3lf°C\n", value, f2c(value));
  }

  return 0;
}